

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t COVER_buildDictionary
                 (COVER_ctx_t *ctx,U32 *freqs,COVER_map_t *activeDmers,void *dictBuffer,
                 size_t dictBufferCapacity,ZDICT_cover_params_t parameters)

{
  uint *puVar1;
  U32 UVar2;
  U32 UVar3;
  COVER_map_pair_t *pCVar4;
  char cVar5;
  size_t sVar6;
  COVER_epoch_info_t CVar7;
  ulong uVar8;
  U32 *pUVar9;
  clock_t cVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  COVER_map_pair_t *pCVar22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  uint local_bc;
  size_t local_a0;
  
  CVar7 = COVER_computeEpochs((U32)dictBufferCapacity,(U32)ctx->suffixSize,parameters.k,4);
  uVar8 = (ulong)CVar7 >> 3 & 0x1fffffff;
  uVar11 = 100;
  if ((uint)uVar8 < 100) {
    uVar11 = uVar8;
  }
  uVar8 = 10;
  if (0x4f < CVar7.num) {
    uVar8 = uVar11;
  }
  if (1 < g_displayLevel) {
    COVER_buildDictionary_cold_1();
  }
  if (dictBufferCapacity == 0) {
    local_a0 = 0;
    sVar6 = local_a0;
  }
  else {
    local_a0 = 0;
    uVar11 = 0;
    uVar12 = 0;
    do {
      uVar14 = uVar12 * ((ulong)CVar7 >> 0x20);
      uVar16 = (uint)uVar14 + CVar7.size;
      memset(activeDmers->data,0xff,(ulong)activeDmers->size << 3);
      bVar25 = true;
      uVar20 = 0;
      uVar15 = 0;
      if ((uint)uVar14 < uVar16) {
        uVar21 = uVar14 & 0xffffffff;
        uVar15 = 0;
        uVar24 = 0;
        local_bc = 0;
        uVar13 = 0;
        do {
          uVar20 = ctx->dmerAt[uVar21];
          pUVar9 = COVER_map_at(activeDmers,uVar20);
          if (*pUVar9 == 0) {
            local_bc = local_bc + freqs[uVar20];
          }
          uVar21 = uVar21 + 1;
          *pUVar9 = *pUVar9 + 1;
          if ((int)uVar21 - (int)uVar14 == (parameters.k - parameters.d) + 2) {
            uVar20 = ctx->dmerAt[uVar14 & 0xffffffff];
            uVar18 = (ulong)uVar20;
            pUVar9 = COVER_map_at(activeDmers,uVar20);
            uVar14 = (ulong)((int)uVar14 + 1);
            *pUVar9 = *pUVar9 - 1;
            if (*pUVar9 == 0) {
              cVar5 = (char)activeDmers->sizeLog;
              uVar19 = uVar20 * -0x61c8864f >> (-cVar5 & 0x1fU);
              pCVar4 = activeDmers->data;
              while( true ) {
                if (pCVar4[uVar19].value == 0xffffffff) {
                  bVar25 = false;
                  uVar18 = (ulong)uVar19;
                }
                else {
                  bVar25 = pCVar4[uVar19].key != uVar20;
                  uVar18 = uVar18 & 0xffffffff;
                  if (!bVar25) {
                    uVar18 = (ulong)uVar19;
                  }
                }
                if (!bVar25) break;
                uVar19 = uVar19 + 1 & activeDmers->sizeMask;
              }
              if (pCVar4[uVar18].value != 0xffffffff) {
                pCVar22 = pCVar4 + uVar18;
                uVar19 = activeDmers->sizeMask;
                uVar23 = 1;
                do {
                  uVar17 = (int)uVar18 + 1U & uVar19;
                  uVar18 = (ulong)uVar17;
                  UVar2 = pCVar4[uVar18].value;
                  if (UVar2 == 0xffffffff) {
                    pCVar22->value = 0xffffffff;
                  }
                  else {
                    UVar3 = pCVar4[uVar18].key;
                    if ((uVar17 - (UVar3 * -0x61c8864f >> (0x20U - cVar5 & 0x1f)) & uVar19) < uVar23
                       ) {
                      uVar23 = uVar23 + 1;
                    }
                    else {
                      pCVar22->key = UVar3;
                      pCVar22->value = UVar2;
                      uVar23 = 1;
                      pCVar22 = pCVar4 + uVar18;
                    }
                  }
                } while (UVar2 != 0xffffffff);
              }
              local_bc = local_bc - freqs[uVar20];
            }
          }
          uVar19 = uVar13;
          if (uVar13 < local_bc) {
            uVar24 = uVar21 & 0xffffffff;
            uVar19 = local_bc;
          }
          uVar20 = (uint)uVar24;
          if (uVar13 < local_bc) {
            uVar15 = uVar14 & 0xffffffff;
          }
          uVar13 = uVar19;
        } while (uVar21 != uVar16);
        bVar25 = uVar19 == 0;
      }
      uVar16 = (uint)uVar15;
      if (uVar16 == uVar20) {
        uVar14 = (ulong)uVar20;
      }
      else {
        uVar14 = (ulong)uVar20;
        uVar21 = uVar15;
        do {
          uVar24 = uVar14;
          if ((uint)uVar21 <= (uint)uVar14) {
            uVar24 = uVar21;
          }
          puVar1 = ctx->dmerAt + uVar21;
          uVar13 = (uint)uVar21 + 1;
          uVar21 = (ulong)uVar13;
          if (freqs[*puVar1] != 0) {
            uVar15 = uVar21;
            uVar14 = uVar24;
          }
          uVar16 = (uint)uVar15;
        } while (uVar20 != uVar13);
      }
      if ((uint)uVar14 != uVar16) {
        pUVar9 = ctx->dmerAt;
        uVar15 = uVar14;
        do {
          freqs[pUVar9[uVar15]] = 0;
          uVar20 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar20;
        } while (uVar16 != uVar20);
      }
      if (bVar25) {
        uVar11 = uVar11 + 1;
        bVar25 = uVar8 <= uVar11;
      }
      else {
        uVar11 = (ulong)(uVar16 + parameters.d + ~(uint)uVar14);
        if (dictBufferCapacity < uVar11) {
          uVar11 = dictBufferCapacity;
        }
        if (uVar11 < parameters.d) {
          bVar25 = true;
          uVar11 = 0;
        }
        else {
          dictBufferCapacity = dictBufferCapacity - uVar11;
          memcpy((void *)((long)dictBuffer + dictBufferCapacity),ctx->samples + uVar14,uVar11);
          if ((1 < g_displayLevel) &&
             ((cVar10 = clock(), 150000 < cVar10 - g_time || (3 < g_displayLevel)))) {
            COVER_buildDictionary_cold_2();
          }
          uVar11 = 0;
          bVar25 = false;
        }
      }
      sVar6 = dictBufferCapacity;
    } while ((!bVar25) &&
            (uVar12 = (uVar12 + 1) % ((ulong)CVar7 & 0xffffffff), sVar6 = local_a0,
            dictBufferCapacity != 0));
  }
  local_a0 = sVar6;
  if (1 < g_displayLevel) {
    COVER_buildDictionary_cold_3();
  }
  return local_a0;
}

Assistant:

static size_t COVER_buildDictionary(const COVER_ctx_t *ctx, U32 *freqs,
                                    COVER_map_t *activeDmers, void *dictBuffer,
                                    size_t dictBufferCapacity,
                                    ZDICT_cover_params_t parameters) {
  BYTE *const dict = (BYTE *)dictBuffer;
  size_t tail = dictBufferCapacity;
  /* Divide the data into epochs. We will select one segment from each epoch. */
  const COVER_epoch_info_t epochs = COVER_computeEpochs(
      (U32)dictBufferCapacity, (U32)ctx->suffixSize, parameters.k, 4);
  const size_t maxZeroScoreRun = MAX(10, MIN(100, epochs.num >> 3));
  size_t zeroScoreRun = 0;
  size_t epoch;
  DISPLAYLEVEL(2, "Breaking content into %u epochs of size %u\n",
                (U32)epochs.num, (U32)epochs.size);
  /* Loop through the epochs until there are no more segments or the dictionary
   * is full.
   */
  for (epoch = 0; tail > 0; epoch = (epoch + 1) % epochs.num) {
    const U32 epochBegin = (U32)(epoch * epochs.size);
    const U32 epochEnd = epochBegin + epochs.size;
    size_t segmentSize;
    /* Select a segment */
    COVER_segment_t segment = COVER_selectSegment(
        ctx, freqs, activeDmers, epochBegin, epochEnd, parameters);
    /* If the segment covers no dmers, then we are out of content.
     * There may be new content in other epochs, for continue for some time.
     */
    if (segment.score == 0) {
      if (++zeroScoreRun >= maxZeroScoreRun) {
          break;
      }
      continue;
    }
    zeroScoreRun = 0;
    /* Trim the segment if necessary and if it is too small then we are done */
    segmentSize = MIN(segment.end - segment.begin + parameters.d - 1, tail);
    if (segmentSize < parameters.d) {
      break;
    }
    /* We fill the dictionary from the back to allow the best segments to be
     * referenced with the smallest offsets.
     */
    tail -= segmentSize;
    memcpy(dict + tail, ctx->samples + segment.begin, segmentSize);
    DISPLAYUPDATE(
        2, "\r%u%%       ",
        (unsigned)(((dictBufferCapacity - tail) * 100) / dictBufferCapacity));
  }
  DISPLAYLEVEL(2, "\r%79s\r", "");
  return tail;
}